

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

size_t __thiscall fmt::v10::detail::code_point_index(detail *this,string_view s,size_t n)

{
  anon_class_24_3_b33ccaaf_for_f f;
  string_view s_00;
  iterator pcVar1;
  char *begin;
  size_t result;
  size_t n_local;
  string_view s_local;
  
  result = s.size_;
  s_local.data_ = s.data_;
  n_local = (size_t)this;
  begin = (char *)basic_string_view<char>::size((basic_string_view<char> *)&n_local);
  pcVar1 = basic_string_view<char>::begin((basic_string_view<char> *)&n_local);
  s_00.size_ = (size_t)s_local.data_;
  s_00.data_ = (char *)n_local;
  f.n = &result;
  f.begin = pcVar1;
  f.result = (size_t *)&begin;
  for_each_codepoint<fmt::v10::detail::code_point_index(fmt::v10::basic_string_view<char>,unsigned_long)::_lambda(unsigned_int,fmt::v10::basic_string_view<char>)_1_>
            (s_00,f);
  return (size_t)begin;
}

Assistant:

inline auto code_point_index(string_view s, size_t n) -> size_t {
  size_t result = s.size();
  const char* begin = s.begin();
  for_each_codepoint(s, [begin, &n, &result](uint32_t, string_view sv) {
    if (n != 0) {
      --n;
      return true;
    }
    result = to_unsigned(sv.begin() - begin);
    return false;
  });
  return result;
}